

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBAmrUtil.cpp
# Opt level: O2

void amrex::TagCutCells(TagBoxArray *tags,MultiFab *state)

{
  int iVar1;
  int iVar2;
  EBCellFlagFab *this;
  FabType FVar3;
  EBFArrayBoxFactory *this_00;
  FabArray<amrex::EBCellFlagFab> *pFVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int i;
  long lVar8;
  uint32_t *puVar9;
  long lVar10;
  uint32_t *puVar11;
  long lVar12;
  uint32_t *puVar13;
  Box local_10c;
  FabArray<amrex::EBCellFlagFab> *local_f0;
  FabArray<amrex::TagBox> *local_e8;
  long local_e0;
  long local_d8;
  Array4<char> local_d0;
  MFIter mfi;
  
  local_e8 = &tags->super_FabArray<amrex::TagBox>;
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  if (this_00 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  pFVar4 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
  MFIter::MFIter(&mfi,(FabArrayBase *)state,true);
  local_f0 = pFVar4;
  while( true ) {
    piVar5 = &mfi.currentIndex;
    if (mfi.endIndex <= mfi.currentIndex) break;
    MFIter::tilebox(&local_10c,&mfi);
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar5 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    this = (pFVar4->m_fabs_v).
           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
           _M_impl.super__Vector_impl_data._M_start[*piVar5];
    FVar3 = EBCellFlagFab::getType(this,&local_10c);
    if ((uint)(FVar3 + covered) < 0xfffffffe) {
      FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(&local_d0,local_e8,&mfi);
      iVar1 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
      iVar2 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      lVar6 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar1) + 1);
      lVar7 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] - iVar2) + 1);
      local_d8 = (long)local_10c.smallend.vect[1];
      lVar12 = (long)local_10c.smallend.vect[2];
      puVar13 = (uint32_t *)
                ((long)&(this->super_BaseFab<amrex::EBCellFlag>).dptr
                        [(long)local_10c.smallend.vect[0] - (long)iVar1].flag +
                (local_d8 * 4 +
                 (lVar12 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2]) * lVar7
                 * 4 + (long)iVar2 * -4) * lVar6);
      local_e0 = (long)local_10c.bigend.vect[2];
      for (; pFVar4 = local_f0, lVar10 = local_d8, puVar11 = puVar13, lVar12 <= local_e0;
          lVar12 = lVar12 + 1) {
        for (; lVar8 = (long)local_10c.smallend.vect[0], puVar9 = puVar11,
            lVar10 <= local_10c.bigend.vect[1]; lVar10 = lVar10 + 1) {
          for (; lVar8 <= local_10c.bigend.vect[0]; lVar8 = lVar8 + 1) {
            if ((*puVar9 & 3) == 1) {
              local_d0.p
              [lVar8 + (((lVar10 - local_d0.begin.y) * local_d0.jstride +
                        (lVar12 - local_d0.begin.z) * local_d0.kstride) - (long)local_d0.begin.x)] =
                   '\x02';
            }
            puVar9 = puVar9 + 1;
          }
          puVar11 = puVar11 + lVar6;
        }
        puVar13 = puVar13 + lVar7 * lVar6;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
TagCutCells (TagBoxArray& tags, const MultiFab& state)
{
    const char   tagval = TagBox::SET;
//    const char clearval = TagBox::CLEAR;

    auto const& factory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());
    auto const& flags = factory.getMultiEBCellFlagFab();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(state, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        const auto& flag = flags[mfi];

        const FabType typ = flag.getType(bx);
        if (typ != FabType::regular && typ != FabType::covered)
        {
            Array4<char> const& tagarr = tags.array(mfi);
            Array4<EBCellFlag const> const& flagarr = flag.const_array();
            AMREX_HOST_DEVICE_FOR_3D (bx, i, j, k,
            {
                if (flagarr(i,j,k).isSingleValued()) {
                    tagarr(i,j,k) = tagval;
                }
            });
        }
    }
}